

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  ImDrawCmd *local_28;
  ImDrawCmd *curr_cmd;
  void *callback_data_local;
  ImDrawCallback callback_local;
  ImDrawList *this_local;
  
  local_28 = (this->CmdBuffer).Data + ((this->CmdBuffer).Size + -1);
  if (local_28->UserCallback == (ImDrawCallback)0x0) {
    if (local_28->ElemCount != 0) {
      AddDrawCmd(this);
      local_28 = (this->CmdBuffer).Data + ((this->CmdBuffer).Size + -1);
    }
    local_28->UserCallback = callback;
    local_28->UserCallbackData = callback_data;
    AddDrawCmd(this);
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                ,0x1e3,"void ImDrawList::AddCallback(ImDrawCallback, void *)");
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    }
    curr_cmd->UserCallback = callback;
    curr_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}